

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execCmpm<(moira::Instr)40,(moira::Mode)3,(moira::Size)4>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 uVar2;
  long lVar3;
  u32 data2;
  u32 data1;
  u32 ea2;
  u32 ea1;
  uint local_20;
  uint local_1c;
  u32 local_18;
  u32 local_14;
  
  bVar1 = readOp<(moira::Mode)3,(moira::Size)4,64ul>(this,opcode & 7,&local_14,&local_1c);
  if (bVar1) {
    bVar1 = readOp<(moira::Mode)3,(moira::Size)4,64ul>(this,opcode >> 9 & 7,&local_18,&local_20);
    if (bVar1) {
      lVar3 = (ulong)local_20 - (ulong)local_1c;
      (this->reg).sr.c = (bool)((byte)((ulong)lVar3 >> 0x20) & 1);
      (this->reg).sr.v = (int)(((uint)lVar3 ^ local_20) & (local_1c ^ local_20)) < 0;
      (this->reg).sr.z = (uint)lVar3 == 0;
      (this->reg).sr.n = (bool)((byte)((ulong)lVar3 >> 0x18) >> 7);
      uVar2 = (this->reg).pc;
      (this->reg).pc0 = uVar2;
      (this->queue).ird = (this->queue).irc;
      uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar2 + 2);
      (this->queue).irc = (u16)uVar2;
    }
  }
  return;
}

Assistant:

void
Moira::execCmpm(u16 opcode)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    u32 ea1, ea2, data1, data2;

    if (!readOp<M,S, AE_INC_PC>(src, ea1, data1)) return;
    if (!readOp<M,S, AE_INC_PC>(dst, ea2, data2)) return;

    cmp<S>(data1, data2);
    prefetch<POLLIPL>();
}